

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void cmGlobalNinjaGenerator::WriteRule(ostream *os,cmNinjaRule *rule)

{
  ostream *poVar1;
  allocator<char> local_49;
  anon_class_8_1_3fcf66a2 writeKV;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((rule->Name)._M_string_length == 0) {
    std::operator+(&local_40,"No name given for WriteRule! called with comment: ",&rule->Comment);
    cmSystemTools::Error(&local_40);
  }
  else if ((rule->Command)._M_string_length == 0) {
    std::operator+(&local_40,"No command given for WriteRule! called with comment: ",&rule->Comment)
    ;
    cmSystemTools::Error(&local_40);
  }
  else {
    if (((rule->RspFile)._M_string_length == 0) || ((rule->RspContent)._M_string_length != 0)) {
      WriteComment(os,&rule->Comment);
      poVar1 = std::operator<<(os,"rule ");
      poVar1 = std::operator<<(poVar1,(string *)rule);
      std::operator<<(poVar1,'\n');
      writeKV.os = os;
      WriteRule::anon_class_8_1_3fcf66a2::operator()(&writeKV,"depfile",&rule->DepFile);
      WriteRule::anon_class_8_1_3fcf66a2::operator()(&writeKV,"deps",&rule->DepType);
      WriteRule::anon_class_8_1_3fcf66a2::operator()(&writeKV,"command",&rule->Command);
      WriteRule::anon_class_8_1_3fcf66a2::operator()(&writeKV,"description",&rule->Description);
      if ((rule->RspFile)._M_string_length != 0) {
        WriteRule::anon_class_8_1_3fcf66a2::operator()(&writeKV,"rspfile",&rule->RspFile);
        WriteRule::anon_class_8_1_3fcf66a2::operator()(&writeKV,"rspfile_content",&rule->RspContent)
        ;
      }
      WriteRule::anon_class_8_1_3fcf66a2::operator()(&writeKV,"restat",&rule->Restat);
      if (rule->Generator == true) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"1",&local_49);
        WriteRule::anon_class_8_1_3fcf66a2::operator()(&writeKV,"generator",&local_40);
        std::__cxx11::string::~string((string *)&local_40);
      }
      std::operator<<(os,'\n');
      return;
    }
    std::operator+(&local_40,
                   "rspfile but no rspfile_content given for WriteRule! called with comment: ",
                   &rule->Comment);
    cmSystemTools::Error(&local_40);
  }
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteRule(std::ostream& os,
                                       cmNinjaRule const& rule)
{
  // -- Parameter checks
  // Make sure the rule has a name.
  if (rule.Name.empty()) {
    cmSystemTools::Error("No name given for WriteRule! called with comment: " +
                         rule.Comment);
    return;
  }

  // Make sure a command is given.
  if (rule.Command.empty()) {
    cmSystemTools::Error(
      "No command given for WriteRule! called with comment: " + rule.Comment);
    return;
  }

  // Make sure response file content is given
  if (!rule.RspFile.empty() && rule.RspContent.empty()) {
    cmSystemTools::Error("rspfile but no rspfile_content given for WriteRule! "
                         "called with comment: " +
                         rule.Comment);
    return;
  }

  // -- Write rule
  // Write rule intro
  cmGlobalNinjaGenerator::WriteComment(os, rule.Comment);
  os << "rule " << rule.Name << '\n';

  // Write rule key/value pairs
  auto writeKV = [&os](const char* key, std::string const& value) {
    if (!value.empty()) {
      cmGlobalNinjaGenerator::Indent(os, 1);
      os << key << " = " << value << '\n';
    }
  };

  writeKV("depfile", rule.DepFile);
  writeKV("deps", rule.DepType);
  writeKV("command", rule.Command);
  writeKV("description", rule.Description);
  if (!rule.RspFile.empty()) {
    writeKV("rspfile", rule.RspFile);
    writeKV("rspfile_content", rule.RspContent);
  }
  writeKV("restat", rule.Restat);
  if (rule.Generator) {
    writeKV("generator", "1");
  }

  // Finish rule
  os << '\n';
}